

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFactoryRegistry.cpp
# Opt level: O1

TestFactoryRegistryList * CppUnit::TestFactoryRegistryList::getInstance(void)

{
  if (getInstance()::list == '\0') {
    getInstance();
  }
  return &getInstance::list;
}

Assistant:

static TestFactoryRegistryList *getInstance()
  {
    static TestFactoryRegistryList list;
    return &list;
  }